

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O1

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::SimplifyLocals<false,_false,_false>::create(SimplifyLocals<false,_false,_false> *this)

{
  _func_int **__s;
  
  __s = (_func_int **)operator_new(0x368);
  memset(__s,0,0x368);
  __s[1] = (_func_int *)0x0;
  __s[2] = (_func_int *)(__s + 4);
  __s[3] = (_func_int *)0x0;
  *(undefined1 *)(__s + 4) = 0;
  __s[6] = (_func_int *)0x0;
  __s[7] = (_func_int *)0x0;
  __s[0x1c] = (_func_int *)0x0;
  __s[0x1d] = (_func_int *)0x0;
  __s[0x1e] = (_func_int *)0x0;
  __s[0x1f] = (_func_int *)0x0;
  __s[0x20] = (_func_int *)0x0;
  *__s = (_func_int *)&PTR__SimplifyLocals_00d8b4e0;
  *(undefined4 *)(__s + 0x22) = 0;
  __s[0x23] = (_func_int *)0x0;
  __s[0x24] = (_func_int *)(__s + 0x22);
  __s[0x25] = (_func_int *)(__s + 0x22);
  __s[0x26] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x28) = 0;
  __s[0x29] = (_func_int *)0x0;
  __s[0x2a] = (_func_int *)(__s + 0x28);
  __s[0x2b] = (_func_int *)(__s + 0x28);
  __s[0x2c] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x2e) = 0;
  __s[0x2f] = (_func_int *)0x0;
  __s[0x30] = (_func_int *)(__s + 0x2e);
  __s[0x31] = (_func_int *)(__s + 0x2e);
  __s[0x37] = (_func_int *)0x0;
  __s[0x38] = (_func_int *)0x0;
  __s[0x56] = (_func_int *)0x0;
  __s[0x34] = (_func_int *)0x0;
  __s[0x35] = (_func_int *)0x0;
  __s[0x32] = (_func_int *)0x0;
  __s[0x33] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x55) = 0;
  __s[0x53] = (_func_int *)0x0;
  __s[0x54] = (_func_int *)0x0;
  __s[0x51] = (_func_int *)0x0;
  __s[0x52] = (_func_int *)0x0;
  __s[0x4f] = (_func_int *)0x0;
  __s[0x50] = (_func_int *)0x0;
  __s[0x4d] = (_func_int *)0x0;
  __s[0x4e] = (_func_int *)0x0;
  __s[0x6b] = (_func_int *)0x0;
  __s[0x6c] = (_func_int *)0x0;
  __s[0x69] = (_func_int *)0x0;
  __s[0x6a] = (_func_int *)0x0;
  __s[0x67] = (_func_int *)0x0;
  __s[0x68] = (_func_int *)0x0;
  __s[0x65] = (_func_int *)0x0;
  __s[0x66] = (_func_int *)0x0;
  __s[99] = (_func_int *)0x0;
  __s[100] = (_func_int *)0x0;
  __s[0x61] = (_func_int *)0x0;
  __s[0x62] = (_func_int *)0x0;
  (this->
  super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
  ).super_Pass._vptr_Pass = __s;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<
      SimplifyLocals<allowTee, allowStructure, allowNesting>>();
  }